

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

void __thiscall DomCustomWidget::~DomCustomWidget(DomCustomWidget *this)

{
  DomHeader *this_00;
  DomSlots *this_01;
  DomPropertySpecifications *this_02;
  Data *pDVar1;
  
  this_00 = this->m_header;
  if (this_00 != (DomHeader *)0x0) {
    DomHeader::~DomHeader(this_00);
    operator_delete(this_00,0x38);
  }
  if (this->m_sizeHint != (DomSize *)0x0) {
    operator_delete(this->m_sizeHint,0xc);
  }
  this_01 = this->m_slots;
  if (this_01 != (DomSlots *)0x0) {
    DomSlots::~DomSlots(this_01);
    operator_delete(this_01,0x38);
  }
  this_02 = this->m_propertyspecifications;
  if (this_02 != (DomPropertySpecifications *)0x0) {
    DomPropertySpecifications::~DomPropertySpecifications(this_02);
    operator_delete(this_02,0x38);
  }
  pDVar1 = (this->m_pixmap).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_pixmap).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->m_addPageMethod).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_addPageMethod).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->m_extends).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_extends).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->m_class).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_class).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

DomCustomWidget::~DomCustomWidget()
{
    delete m_header;
    delete m_sizeHint;
    delete m_slots;
    delete m_propertyspecifications;
}